

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O3

int Abc_NodeCompareLevelsInc(int *pp1,int *pp2)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = *pp1;
  if (-1 < (long)iVar1) {
    if (iVar1 < s_pLeaves->nSize) {
      uVar3 = *pp2;
      if ((-1 < (long)(int)uVar3) && (uVar3 < (uint)s_pLeaves->nSize)) {
        uVar2 = *(uint *)((long)s_pLeaves->pArray[iVar1] + 0x14) >> 0xc;
        uVar4 = *(uint *)((long)s_pLeaves->pArray[(int)uVar3] + 0x14) >> 0xc;
        uVar3 = 0xffffffff;
        if (uVar4 <= uVar2) {
          uVar3 = (uint)(uVar4 < uVar2);
        }
        return uVar3;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Abc_NodeCompareLevelsInc( int * pp1, int * pp2 )
{
    Abc_Obj_t * pNode1, * pNode2;
    pNode1 = (Abc_Obj_t *)Vec_PtrEntry(s_pLeaves, *pp1);
    pNode2 = (Abc_Obj_t *)Vec_PtrEntry(s_pLeaves, *pp2);
    if ( pNode1->Level < pNode2->Level )
        return -1;
    if ( pNode1->Level > pNode2->Level ) 
        return 1;
    return 0; 
}